

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TriangularSolverMatrix.h
# Opt level: O1

void Eigen::internal::triangular_solve_matrix<double,_long,_1,_5,_false,_0,_0>::run
               (long size,long otherSize,double *_tri,long triStride,double *_other,long otherStride
               ,level3_blocking<double,_double> *blocking)

{
  ResScalar *res;
  double dVar1;
  RhsScalar *pRVar2;
  ulong cols_00;
  LhsScalar *pLVar3;
  ulong uVar4;
  undefined8 *puVar5;
  int iVar6;
  uint uVar7;
  ulong uVar8;
  double *pdVar9;
  ulong uVar10;
  long lVar11;
  double *pdVar12;
  RhsScalar RVar13;
  double *pdVar14;
  size_t __size;
  long lVar15;
  double *pdVar16;
  double *pdVar17;
  ulong uVar18;
  long lVar19;
  long lVar20;
  double dStack_1b8;
  long local_1b0;
  ulong local_1a8;
  long local_1a0;
  long local_198;
  long local_190;
  long local_188;
  ulong local_180;
  ulong local_178;
  long local_170;
  long local_168;
  RhsScalar *local_160;
  double *local_158;
  double *local_150;
  double *local_148;
  ulong local_140;
  double *local_138;
  double *local_130;
  long local_128;
  double *local_120;
  double *local_118;
  ulong local_110;
  int local_104;
  double *pdStack_100;
  int l1;
  long local_f8;
  ulong local_f0;
  long local_e8;
  double *local_e0;
  long local_d8;
  ulong local_d0;
  ulong local_c8;
  ulong local_c0;
  long local_b8;
  RhsScalar *local_b0;
  RhsScalar *local_a8;
  LhsScalar *local_a0;
  RhsScalar *local_98;
  RhsScalar *local_90;
  uint local_88;
  uint local_84;
  int l2;
  int l3;
  long local_78;
  ulong local_70;
  double *local_68;
  double *local_60;
  LhsScalar *local_58;
  RhsScalar local_50;
  long cols;
  ulong uStack_40;
  gemm_pack_rhs<double,_long,_4,_0,_false,_true> pack_rhs;
  gebp_kernel<double,_double,_long,_4,_4,_false,_false> local_32;
  gemm_pack_lhs<double,_long,_4,_2,_0,_false,_false> local_31 [7];
  gebp_kernel<double,_double,_long,_4,_4,_false,_false> gebp_kernel;
  gemm_pack_lhs<double,_long,_4,_2,_0,_false,_false> pack_lhs;
  
  pdVar9 = &dStack_1b8;
  local_e8 = triStride;
  local_148 = _tri;
  local_50 = (RhsScalar)otherSize;
  local_70 = size;
  lVar15 = blocking->m_mc;
  if (size <= blocking->m_mc) {
    lVar15 = size;
  }
  uStack_40 = blocking->m_kc;
  uVar18 = lVar15 * blocking->m_kc;
  if (uVar18 >> 0x3d != 0) {
LAB_0010d285:
    puVar5 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar5 = operator_delete;
    __cxa_throw(puVar5,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
  }
  local_58 = blocking->m_blockA;
  if (blocking->m_blockA == (LhsScalar *)0x0) {
    if (uVar18 < 0x4001) {
      pdVar9 = (double *)((long)&dStack_1b8 - (uVar18 * 8 + 0xf & 0xfffffffffffffff0));
      local_a0 = pdVar9;
      local_58 = pdVar9;
    }
    else {
      local_58 = (LhsScalar *)malloc(uVar18 * 8);
      local_a0 = local_58;
      if (local_58 == (LhsScalar *)0x0) goto LAB_0010d285;
    }
  }
  else {
    local_a0 = (LhsScalar *)0x0;
    pdVar9 = &dStack_1b8;
  }
  uVar8 = uStack_40 * (long)local_50;
  local_d0 = uVar8;
  if (0x1fffffffffffffff < uVar8) {
    pdVar9[-1] = 5.4471972618112e-318;
    puVar5 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar5 = operator_delete;
    pdVar9[-1] = 5.44737512544371e-318;
    __cxa_throw(puVar5,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
  }
  local_a8 = blocking->m_blockB;
  if (blocking->m_blockB == (RhsScalar *)0x0) {
    if (uVar8 < 0x4001) {
      pdVar9 = (double *)((long)pdVar9 - (uVar8 * 8 + 0xf & 0xfffffffffffffff0));
      local_98 = pdVar9;
      local_a8 = pdVar9;
    }
    else {
      pdVar9[-1] = 5.43770132009813e-318;
      local_a8 = (RhsScalar *)malloc(uVar8 * 8);
      local_98 = local_a8;
      if (local_a8 == (RhsScalar *)0x0) {
        pdVar9[-1] = 5.44767650548767e-318;
        puVar5 = (undefined8 *)__cxa_allocate_exception(8);
        *puVar5 = operator_delete;
        pdVar9[-1] = 5.44785436912017e-318;
        __cxa_throw(puVar5,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
      }
    }
  }
  else {
    local_98 = (RhsScalar *)0x0;
  }
  RVar13 = local_50;
  if ((uStack_40 & 0x1c00000000000000) != 0) {
    pdVar9[-1] = 5.44742453200829e-318;
    puVar5 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar5 = operator_delete;
    pdVar9[-1] = 5.44760239564079e-318;
    __cxa_throw(puVar5,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
  }
  local_b0 = blocking->m_blockW;
  if (blocking->m_blockW == (RhsScalar *)0x0) {
    __size = uStack_40 * 0x40;
    if (__size < 0x20001) {
      pdVar9 = pdVar9 + uStack_40 * -8;
      local_90 = pdVar9;
      local_b0 = pdVar9;
    }
    else {
      pdVar9[-1] = 5.43837819003294e-318;
      local_b0 = (RhsScalar *)malloc(__size);
      local_90 = local_b0;
      if (local_b0 == (RhsScalar *)0x0) {
        pdVar9[-1] = 5.44790377568476e-318;
        puVar5 = (undefined8 *)__cxa_allocate_exception(8);
        *puVar5 = operator_delete;
        pdVar9[-1] = (double)&LAB_0010d370;
        __cxa_throw(puVar5,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
      }
    }
  }
  else {
    local_90 = (RhsScalar *)0x0;
  }
  local_110 = uStack_40 << 6;
  if (manage_caching_sizes(Eigen::Action,long*,long*)::m_l2CacheSize == 0) {
    local_104 = -1;
    pdVar9[-1] = 5.43875862058023e-318;
    queryCacheSizes(&local_104,(int *)&local_88,(int *)&local_84);
    iVar6 = 0x2000;
    if (0 < local_104) {
      iVar6 = local_104;
    }
    manage_caching_sizes(Eigen::Action,long*,long*)::m_l1CacheSize = (long)iVar6;
    local_88 = 0xffffffff;
    local_84 = 0xffffffff;
    pdVar9[-1] = 5.43901059405961e-318;
    queryCacheSizes(&local_104,(int *)&local_88,(int *)&local_84);
    uVar7 = local_84;
    if ((int)local_84 < (int)local_88) {
      uVar7 = local_88;
    }
    manage_caching_sizes(Eigen::Action,long*,long*)::m_l2CacheSize = 0x100000;
    if (0 < (int)uVar7) {
      manage_caching_sizes(Eigen::Action,long*,long*)::m_l2CacheSize = (ulong)uVar7;
    }
  }
  local_d8 = lVar15;
  local_c8 = uVar18;
  if ((long)RVar13 < 1) {
    uVar18 = 0;
  }
  else {
    uVar18 = local_70;
    if ((long)local_70 < otherStride) {
      uVar18 = otherStride;
    }
    uVar8 = manage_caching_sizes(Eigen::Action,long*,long*)::m_l2CacheSize / (uVar18 << 5);
    uVar18 = uVar8 + 3;
    if (-1 < (long)uVar8) {
      uVar18 = uVar8;
    }
    uVar18 = uVar18 & 0xfffffffffffffffc;
  }
  if ((long)uVar18 < 5) {
    uVar18 = 4;
  }
  if (0 < (long)local_70) {
    local_118 = _other + 1;
    local_170 = uStack_40 * 8;
    local_190 = otherStride * uVar18 * 8;
    local_138 = local_148 + 1;
    local_1b0 = local_e8 * 8 + 8;
    local_168 = uStack_40 * local_1b0;
    local_198 = local_e8 * 0x20 + 0x20;
    local_130 = _other + uStack_40;
    local_188 = lVar15 * 8;
    local_128 = local_70 - uStack_40;
    local_120 = local_148 + uStack_40;
    local_140 = uVar18;
    uVar18 = local_70;
    lVar15 = 0;
    do {
      local_178 = uVar18;
      if ((long)uStack_40 < (long)uVar18) {
        uVar18 = uStack_40;
      }
      local_180 = uVar18;
      uVar18 = local_70 - lVar15;
      if ((long)uStack_40 < (long)(local_70 - lVar15)) {
        uVar18 = uStack_40;
      }
      _l2 = uVar18;
      if (0 < (long)RVar13) {
        local_e0 = local_118;
        lVar11 = 0;
        local_78 = lVar15;
        do {
          local_60 = (double *)lVar11;
          local_c0 = (long)RVar13 - lVar11;
          uVar8 = local_c0;
          if ((long)local_140 < (long)local_c0) {
            uVar8 = local_140;
          }
          local_f0 = uVar8;
          if (0 < (long)uVar18) {
            local_160 = local_a8 + lVar11 * uVar18;
            local_158 = _other + lVar11 * otherStride;
            pdStack_100 = local_138;
            local_150 = local_e0;
            lVar20 = 0;
            uVar10 = local_180;
            do {
              cols_00 = local_f0;
              pRVar2 = local_160;
              local_1a8 = uVar10;
              uVar4 = 4;
              if ((long)uVar10 < 4) {
                uVar4 = uVar10;
              }
              if ((long)uVar4 < 2) {
                uVar4 = 1;
              }
              local_b8 = lVar20;
              local_f8 = uVar18 - lVar20;
              lVar15 = 4;
              if (local_f8 < 4) {
                lVar15 = local_f8;
              }
              local_68 = (double *)lVar15;
              if (0 < local_f8) {
                uVar18 = 0;
                pdVar12 = pdStack_100;
                pdVar14 = local_150;
                do {
                  if (0 < (long)local_c0) {
                    pdVar16 = pdVar14;
                    pdVar17 = local_60;
                    do {
                      if (0 < (long)(~uVar18 + lVar15)) {
                        dVar1 = _other[(long)pdVar17 * otherStride + local_78 + lVar20 + uVar18];
                        lVar19 = 0;
                        do {
                          pdVar16[lVar19] = pdVar12[lVar19] * -dVar1 + pdVar16[lVar19];
                          lVar19 = lVar19 + 1;
                        } while (lVar19 < (long)(~uVar18 + lVar15));
                      }
                      pdVar17 = (double *)((long)pdVar17 + 1);
                      pdVar16 = pdVar16 + otherStride;
                    } while ((long)pdVar17 < (long)(uVar8 + lVar11));
                  }
                  uVar18 = uVar18 + 1;
                  pdVar14 = pdVar14 + 1;
                  pdVar12 = (double *)((long)pdVar12 + local_1b0);
                } while (uVar18 != uVar4);
              }
              local_1a0 = lVar20 + local_78;
              pdVar12 = local_158 + lVar20 + local_78;
              pdVar9[-1] = (double)lVar20;
              pdVar9[-2] = (double)_l2;
              pdVar9[-3] = 5.44310145760718e-318;
              gemm_pack_rhs<double,_long,_4,_0,_false,_true>::operator()
                        ((gemm_pack_rhs<double,_long,_4,_0,_false,_true> *)((long)&cols + 7),pRVar2,
                         pdVar12,otherStride,lVar15,cols_00,(long)pdVar9[-2],(long)pdVar9[-1]);
              lVar20 = local_e8;
              lVar19 = local_f8 - lVar15;
              if (lVar19 != 0 && lVar15 <= local_f8) {
                local_f8 = lVar15 + local_1a0;
                pdVar12 = local_148 + local_1a0 * local_e8 + lVar15 + local_1a0;
                pdVar9[-2] = 0.0;
                pdVar9[-1] = 0.0;
                pLVar3 = local_58;
                pdVar9[-3] = 5.44357576062719e-318;
                gemm_pack_lhs<double,_long,_4,_2,_0,_false,_false>::operator()
                          (local_31,pLVar3,pdVar12,lVar20,lVar15,lVar19,(long)pdVar9[-2],
                           (long)pdVar9[-1]);
                pLVar3 = local_58;
                pdVar12 = local_68;
                pRVar2 = local_160;
                res = local_158 + local_f8;
                pdVar9[-2] = (double)local_b0;
                pdVar9[-3] = (double)local_b8;
                pdVar9[-4] = 0.0;
                pdVar9[-5] = (double)_l2;
                pdVar9[-6] = (double)pdVar12;
                pdVar9[-7] = (double)local_f0;
                pdVar9[-8] = (double)pdVar12;
                pdVar9[-9] = 5.4440253603649e-318;
                gebp_kernel<double,_double,_long,_4,_4,_false,_false>::operator()
                          (&local_32,res,otherStride,pLVar3,pRVar2,lVar19,(long)pdVar9[-8],
                           (long)pdVar9[-7],-1.0,(long)pdVar9[-6],(long)pdVar9[-5],(long)pdVar9[-4],
                           (long)pdVar9[-3],(double *)pdVar9[-2]);
              }
              lVar20 = local_b8 + 4;
              uVar10 = local_1a8 - 4;
              local_150 = local_150 + 4;
              pdStack_100 = (double *)((long)pdStack_100 + local_198);
              uVar18 = _l2;
              lVar15 = local_78;
            } while (lVar20 < (long)_l2);
          }
          lVar11 = (long)local_60 + local_140;
          local_e0 = (double *)((long)local_e0 + local_190);
          RVar13 = local_50;
        } while (lVar11 < (long)local_50);
      }
      lVar15 = lVar15 + uStack_40;
      local_68 = local_120;
      local_c0 = local_128;
      local_60 = local_130;
      local_78 = lVar15;
      if (lVar15 < (long)local_70) {
        do {
          uVar18 = local_c0;
          local_c0 = local_c0 - local_d8;
          if (local_d8 <= (long)uVar18) {
            uVar18 = local_d8;
          }
          if (0 < (long)uVar18) {
            pdVar9[-2] = 0.0;
            pdVar9[-1] = 0.0;
            pLVar3 = local_58;
            pdVar12 = local_68;
            uVar8 = _l2;
            lVar11 = local_e8;
            pdVar9[-3] = 5.44531487170055e-318;
            gemm_pack_lhs<double,_long,_4,_2,_0,_false,_false>::operator()
                      (local_31,pLVar3,pdVar12,lVar11,uVar8,uVar18,(long)pdVar9[-2],(long)pdVar9[-1]
                      );
            uVar8 = _l2;
            pdVar9[-2] = (double)local_b0;
            pdVar9[-4] = 0.0;
            pdVar9[-3] = 0.0;
            pdVar9[-5] = -NAN;
            pdVar9[-6] = -NAN;
            pdVar9[-7] = local_50;
            pdVar9[-8] = (double)uVar8;
            pLVar3 = local_58;
            pdVar12 = local_60;
            pRVar2 = local_a8;
            pdVar9[-9] = 5.44581881865931e-318;
            gebp_kernel<double,_double,_long,_4,_4,_false,_false>::operator()
                      (&local_32,pdVar12,otherStride,pLVar3,pRVar2,uVar18,(long)pdVar9[-8],
                       (long)pdVar9[-7],-1.0,(long)pdVar9[-6],(long)pdVar9[-5],(long)pdVar9[-4],
                       (long)pdVar9[-3],(double *)pdVar9[-2]);
          }
          lVar15 = lVar15 + local_d8;
          local_60 = (double *)((long)local_60 + local_188);
          local_68 = (double *)((long)local_68 + local_188);
        } while (lVar15 < (long)local_70);
      }
      uVar18 = local_178 - uStack_40;
      local_118 = (double *)((long)local_118 + local_170);
      local_138 = (double *)((long)local_138 + local_168);
      local_130 = (double *)((long)local_130 + local_170);
      local_128 = local_128 - uStack_40;
      local_120 = (double *)((long)local_120 + local_168);
      RVar13 = local_50;
      lVar15 = local_78;
    } while (local_78 < (long)local_70);
  }
  pRVar2 = local_90;
  if (0x20000 < local_110) {
    pdVar9[-1] = 5.44658462041036e-318;
    free(pRVar2);
  }
  pRVar2 = local_98;
  uVar18 = local_c8;
  if (0x4000 < local_d0) {
    pdVar9[-1] = 5.44674272141703e-318;
    free(pRVar2);
  }
  pLVar3 = local_a0;
  if (0x4000 < uVar18) {
    pdVar9[-1] = 5.44684647520266e-318;
    free(pLVar3);
  }
  return;
}

Assistant:

EIGEN_DONT_INLINE void triangular_solve_matrix<Scalar,Index,OnTheLeft,Mode,Conjugate,TriStorageOrder,ColMajor>::run(
    Index size, Index otherSize,
    const Scalar* _tri, Index triStride,
    Scalar* _other, Index otherStride,
    level3_blocking<Scalar,Scalar>& blocking)
  {
    Index cols = otherSize;
    const_blas_data_mapper<Scalar, Index, TriStorageOrder> tri(_tri,triStride);
    blas_data_mapper<Scalar, Index, ColMajor> other(_other,otherStride);

    typedef gebp_traits<Scalar,Scalar> Traits;
    enum {
      SmallPanelWidth   = EIGEN_PLAIN_ENUM_MAX(Traits::mr,Traits::nr),
      IsLower = (Mode&Lower) == Lower
    };

    Index kc = blocking.kc();                   // cache block size along the K direction
    Index mc = (std::min)(size,blocking.mc());  // cache block size along the M direction

    std::size_t sizeA = kc*mc;
    std::size_t sizeB = kc*cols;
    std::size_t sizeW = kc*Traits::WorkSpaceFactor;

    ei_declare_aligned_stack_constructed_variable(Scalar, blockA, sizeA, blocking.blockA());
    ei_declare_aligned_stack_constructed_variable(Scalar, blockB, sizeB, blocking.blockB());
    ei_declare_aligned_stack_constructed_variable(Scalar, blockW, sizeW, blocking.blockW());

    conj_if<Conjugate> conj;
    gebp_kernel<Scalar, Scalar, Index, Traits::mr, Traits::nr, Conjugate, false> gebp_kernel;
    gemm_pack_lhs<Scalar, Index, Traits::mr, Traits::LhsProgress, TriStorageOrder> pack_lhs;
    gemm_pack_rhs<Scalar, Index, Traits::nr, ColMajor, false, true> pack_rhs;

    // the goal here is to subdivise the Rhs panels such that we keep some cache
    // coherence when accessing the rhs elements
    std::ptrdiff_t l1, l2;
    manage_caching_sizes(GetAction, &l1, &l2);
    Index subcols = cols>0 ? l2/(4 * sizeof(Scalar) *  std::max<Index>(otherStride,size)) : 0;
    subcols = std::max<Index>((subcols/Traits::nr)*Traits::nr, Traits::nr);

    for(Index k2=IsLower ? 0 : size;
        IsLower ? k2<size : k2>0;
        IsLower ? k2+=kc : k2-=kc)
    {
      const Index actual_kc = (std::min)(IsLower ? size-k2 : k2, kc);

      // We have selected and packed a big horizontal panel R1 of rhs. Let B be the packed copy of this panel,
      // and R2 the remaining part of rhs. The corresponding vertical panel of lhs is split into
      // A11 (the triangular part) and A21 the remaining rectangular part.
      // Then the high level algorithm is:
      //  - B = R1                    => general block copy (done during the next step)
      //  - R1 = A11^-1 B             => tricky part
      //  - update B from the new R1  => actually this has to be performed continuously during the above step
      //  - R2 -= A21 * B             => GEPP

      // The tricky part: compute R1 = A11^-1 B while updating B from R1
      // The idea is to split A11 into multiple small vertical panels.
      // Each panel can be split into a small triangular part T1k which is processed without optimization,
      // and the remaining small part T2k which is processed using gebp with appropriate block strides
      for(Index j2=0; j2<cols; j2+=subcols)
      {
        Index actual_cols = (std::min)(cols-j2,subcols);
        // for each small vertical panels [T1k^T, T2k^T]^T of lhs
        for (Index k1=0; k1<actual_kc; k1+=SmallPanelWidth)
        {
          Index actualPanelWidth = std::min<Index>(actual_kc-k1, SmallPanelWidth);
          // tr solve
          for (Index k=0; k<actualPanelWidth; ++k)
          {
            // TODO write a small kernel handling this (can be shared with trsv)
            Index i  = IsLower ? k2+k1+k : k2-k1-k-1;
            Index rs = actualPanelWidth - k - 1; // remaining size
            Index s  = TriStorageOrder==RowMajor ? (IsLower ? k2+k1 : i+1)
                                                 :  IsLower ? i+1 : i-rs;

            Scalar a = (Mode & UnitDiag) ? Scalar(1) : Scalar(1)/conj(tri(i,i));
            for (Index j=j2; j<j2+actual_cols; ++j)
            {
              if (TriStorageOrder==RowMajor)
              {
                Scalar b(0);
                const Scalar* l = &tri(i,s);
                Scalar* r = &other(s,j);
                for (Index i3=0; i3<k; ++i3)
                  b += conj(l[i3]) * r[i3];

                other(i,j) = (other(i,j) - b)*a;
              }
              else
              {
                Scalar b = (other(i,j) *= a);
                Scalar* r = &other(s,j);
                const Scalar* l = &tri(s,i);
                for (Index i3=0;i3<rs;++i3)
                  r[i3] -= b * conj(l[i3]);
              }
            }
          }

          Index lengthTarget = actual_kc-k1-actualPanelWidth;
          Index startBlock   = IsLower ? k2+k1 : k2-k1-actualPanelWidth;
          Index blockBOffset = IsLower ? k1 : lengthTarget;

          // update the respective rows of B from other
          pack_rhs(blockB+actual_kc*j2, &other(startBlock,j2), otherStride, actualPanelWidth, actual_cols, actual_kc, blockBOffset);

          // GEBP
          if (lengthTarget>0)
          {
            Index startTarget  = IsLower ? k2+k1+actualPanelWidth : k2-actual_kc;

            pack_lhs(blockA, &tri(startTarget,startBlock), triStride, actualPanelWidth, lengthTarget);

            gebp_kernel(&other(startTarget,j2), otherStride, blockA, blockB+actual_kc*j2, lengthTarget, actualPanelWidth, actual_cols, Scalar(-1),
                        actualPanelWidth, actual_kc, 0, blockBOffset, blockW);
          }
        }
      }
      
      // R2 -= A21 * B => GEPP
      {
        Index start = IsLower ? k2+kc : 0;
        Index end   = IsLower ? size : k2-kc;
        for(Index i2=start; i2<end; i2+=mc)
        {
          const Index actual_mc = (std::min)(mc,end-i2);
          if (actual_mc>0)
          {
            pack_lhs(blockA, &tri(i2, IsLower ? k2 : k2-kc), triStride, actual_kc, actual_mc);

            gebp_kernel(_other+i2, otherStride, blockA, blockB, actual_mc, actual_kc, cols, Scalar(-1), -1, -1, 0, 0, blockW);
          }
        }
      }
    }
  }